

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O1

inform_dist * inform_dist_alloc(size_t n)

{
  inform_dist *__ptr;
  uint32_t *puVar1;
  
  if ((n != 0) && (__ptr = (inform_dist *)malloc(0x18), __ptr != (inform_dist *)0x0)) {
    puVar1 = (uint32_t *)calloc(n,4);
    __ptr->histogram = puVar1;
    if (puVar1 != (uint32_t *)0x0) {
      __ptr->size = n;
      __ptr->counts = 0;
      return __ptr;
    }
    free(__ptr);
  }
  return (inform_dist *)0x0;
}

Assistant:

inform_dist* inform_dist_alloc(size_t n)
{
    // if the requested support size is zero, return NULL
    if (n == 0)
    {
        return NULL;
    }
    // allocate the distribution
    inform_dist *dist = malloc(sizeof(inform_dist));
    // if the allocation succeeded
    if (dist != NULL)
    {
        // allocate the underlying histogram
        dist->histogram = calloc(n, sizeof(uint32_t));
        // if the allocation succeeded
        if (dist->histogram != NULL)
        {
            // set the distribution size and counts
            dist->size   = n;
            dist->counts = 0;
        }
        // otherwise free the distribution
        else
        {
            free(dist);
            dist = NULL;
        }
    }
    // return the (potentially NULL) distribution
    return dist;
}